

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall kj::Array<kj::OwnFd>::dispose(Array<kj::OwnFd> *this)

{
  OwnFd *pOVar1;
  size_t sVar2;
  
  pOVar1 = this->ptr;
  if (pOVar1 != (OwnFd *)0x0) {
    sVar2 = this->size_;
    this->ptr = (OwnFd *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pOVar1,4,sVar2,sVar2,ArrayDisposer::Dispose_<kj::OwnFd>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    size_t sizeCopy = size_;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      size_ = 0;
      disposer->dispose(ptrCopy, sizeCopy, sizeCopy);
    }
  }